

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Emb_DumpGraphIntoFile(Emb_Man_t *p)

{
  uint *puVar1;
  uint uVar2;
  FILE *__stream;
  long lVar3;
  uint uVar4;
  
  __stream = fopen("1.g","w");
  uVar4 = 0;
  while (((int)uVar4 < p->nObjData && (p->pObjData != (int *)0x0))) {
    puVar1 = (uint *)(p->pObjData + uVar4);
    if (puVar1[3] == p->nTravIds) {
      for (lVar3 = 0; uVar2 = puVar1[1], (int)lVar3 < (int)uVar2; lVar3 = lVar3 + 1) {
        if (puVar1[(long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar3 + 5] + 3] != p->nTravIds) {
          __assert_fail("Emb_ObjIsTravIdCurrent(p, pNext)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                        ,0x43c,"void Emb_DumpGraphIntoFile(Emb_Man_t *)");
        }
        fprintf(__stream,"%d %d\n",(ulong)puVar1[4],
                (ulong)puVar1[(long)(int)puVar1[(ulong)(*puVar1 >> 4) + lVar3 + 5] + 4]);
      }
    }
    else {
      uVar2 = puVar1[1];
    }
    uVar4 = uVar4 + (*puVar1 >> 4) + uVar2 + 5;
  }
  fclose(__stream);
  return;
}

Assistant:

void Emb_DumpGraphIntoFile( Emb_Man_t * p )
{
    FILE * pFile;
    Emb_Obj_t * pThis, * pNext;
    int i, k;
    pFile = fopen( "1.g", "w" );
    Emb_ManForEachObj( p, pThis, i )
    {
        if ( !Emb_ObjIsTravIdCurrent(p, pThis) )
            continue;
        Emb_ObjForEachFanout( pThis, pNext, k )
        {
            assert( Emb_ObjIsTravIdCurrent(p, pNext) );
            fprintf( pFile, "%d %d\n", pThis->Value, pNext->Value );
        }
    }
    fclose( pFile );
}